

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O0

FT_Error FT_Bitmap_Copy(FT_Library library,FT_Bitmap *source,FT_Bitmap *target)

{
  FT_Free_Func p_Var1;
  bool bVar2;
  FT_Free_Func local_50;
  FT_Byte *t;
  FT_Byte *s;
  FT_UInt i;
  FT_Int flip;
  FT_Int pitch;
  FT_Error error;
  FT_Memory memory;
  FT_Bitmap *target_local;
  FT_Bitmap *source_local;
  FT_Library library_local;
  
  flip = 0;
  if (library == (FT_Library)0x0) {
    library_local._4_4_ = 0x21;
  }
  else if ((source == (FT_Bitmap *)0x0) || (target == (FT_Bitmap *)0x0)) {
    library_local._4_4_ = 6;
  }
  else if (source == target) {
    library_local._4_4_ = 0;
  }
  else {
    if (((-1 < source->pitch) || (bVar2 = true, target->pitch < 1)) &&
       (bVar2 = false, 0 < source->pitch)) {
      bVar2 = target->pitch < 0;
    }
    _pitch = library->memory;
    memory = (FT_Memory)target;
    target_local = source;
    source_local = (FT_Bitmap *)library;
    ft_mem_free(_pitch,target->buffer);
    memory->free = (FT_Free_Func)0x0;
    memcpy(memory,target_local,0x28);
    if (bVar2) {
      *(int *)&memory->alloc = -*(int *)&memory->alloc;
    }
    if (target_local->buffer == (uchar *)0x0) {
      library_local._4_4_ = 0;
    }
    else {
      i = target_local->pitch;
      if ((int)i < 0) {
        i = -i;
      }
      p_Var1 = (FT_Free_Func)
               ft_mem_qrealloc(_pitch,(long)(int)i,0,(ulong)*(uint *)&memory->user,(void *)0x0,&flip
                              );
      memory->free = p_Var1;
      if (flip == 0) {
        if (bVar2) {
          t = target_local->buffer;
          local_50 = memory->free + (long)(int)i * (ulong)(*(int *)&memory->user - 1);
          for (s._0_4_ = *(int *)&memory->user; (int)s != 0; s._0_4_ = (int)s + -1) {
            memcpy(local_50,t,(long)(int)i);
            t = t + (int)i;
            local_50 = local_50 + -(long)(int)i;
          }
        }
        else {
          memcpy(memory->free,target_local->buffer,(ulong)target_local->rows * (long)(int)i);
        }
      }
      library_local._4_4_ = flip;
    }
  }
  return library_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Bitmap_Copy( FT_Library        library,
                  const FT_Bitmap  *source,
                  FT_Bitmap        *target)
  {
    FT_Memory  memory;
    FT_Error   error  = FT_Err_Ok;
    FT_Int     pitch;
    FT_Int     flip;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !source || !target )
      return FT_THROW( Invalid_Argument );

    if ( source == target )
      return FT_Err_Ok;

    flip = ( source->pitch < 0 && target->pitch > 0 ) ||
           ( source->pitch > 0 && target->pitch < 0 );

    memory = library->memory;
    FT_FREE( target->buffer );

    *target = *source;

    if ( flip )
      target->pitch = -target->pitch;

    if ( !source->buffer )
      return FT_Err_Ok;

    pitch  = source->pitch;
    if ( pitch < 0 )
      pitch = -pitch;

    FT_MEM_QALLOC_MULT( target->buffer, target->rows, pitch );

    if ( !error )
    {
      if ( flip )
      {
        /* take care of bitmap flow */
        FT_UInt   i;
        FT_Byte*  s = source->buffer;
        FT_Byte*  t = target->buffer;


        t += (FT_ULong)pitch * ( target->rows - 1 );

        for ( i = target->rows; i > 0; i-- )
        {
          FT_ARRAY_COPY( t, s, pitch );

          s += pitch;
          t -= pitch;
        }
      }
      else
        FT_MEM_COPY( target->buffer, source->buffer,
                     (FT_Long)source->rows * pitch );
    }

    return error;
  }